

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.hxx
# Opt level: O1

void lineage::saveSolution(string *fileName,Solution *solution)

{
  ostream *poVar1;
  ulong uVar2;
  ofstream file;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  std::ofstream::ofstream(&local_220,(string *)fileName,_S_out);
  if ((solution->edge_labels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (solution->edge_labels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar2 = 0;
    do {
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&local_220);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)((long)(solution->edge_labels).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(solution->edge_labels).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start));
  }
  std::ofstream::close();
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

inline
void saveSolution(std::string const& fileName, Solution const& solution)
{
    std::ofstream file(fileName);

    for (size_t j = 0; j < solution.edge_labels.size(); ++j)
        file << static_cast<size_t>(solution.edge_labels[j]) << std::endl;
    
    file.close();
}